

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testCreateNewOrderSingle(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  OrdType ordType;
  Side side;
  Symbol symbol;
  HandlInst handlInst;
  ClOrdID clOrdID;
  TransactTime transactTime;
  FieldBase local_3c8;
  FieldBase local_368;
  FieldBase local_308;
  FieldBase local_2a8;
  FieldBase local_248;
  FieldBase local_1e8;
  Message local_188 [344];
  
  lVar1 = GetTickCount();
  for (iVar3 = 0; iVar3 <= count; iVar3 = iVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"ORDERID",(allocator<char> *)&local_308);
    FIX::ClOrdID::ClOrdID((ClOrdID *)&local_248,(STRING *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    local_308._vptr_FieldBase._0_1_ = 0x31;
    FIX::HandlInst::HandlInst((HandlInst *)&local_2a8,(CHAR *)&local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"LNUX",(allocator<char> *)&local_1e8);
    FIX::Symbol::Symbol((Symbol *)&local_308,(STRING *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    FIX::Side::Side((Side *)&local_368,"11");
    FIX::TransactTime::TransactTime((TransactTime *)&local_1e8);
    FIX::OrdType::OrdType((OrdType *)&local_3c8,"1");
    FIX42::NewOrderSingle::NewOrderSingle
              ((NewOrderSingle *)local_188,(ClOrdID *)&local_248,(HandlInst *)&local_2a8,
               (Symbol *)&local_308,(Side *)&local_368,(TransactTime *)&local_1e8,
               (OrdType *)&local_3c8);
    FIX::Message::~Message(local_188);
    FIX::FieldBase::~FieldBase(&local_3c8);
    FIX::FieldBase::~FieldBase(&local_1e8);
    FIX::FieldBase::~FieldBase(&local_368);
    FIX::FieldBase::~FieldBase(&local_308);
    FIX::FieldBase::~FieldBase(&local_2a8);
    FIX::FieldBase::~FieldBase(&local_248);
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testCreateNewOrderSingle( int count )
{
  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::ClOrdID clOrdID( "ORDERID" );
    FIX::HandlInst handlInst( '1' );
    FIX::Symbol symbol( "LNUX" );
    FIX::Side side( FIX::Side_BUY );
    FIX::TransactTime transactTime;
    FIX::OrdType ordType( FIX::OrdType_MARKET );
    FIX42::NewOrderSingle( clOrdID, handlInst, symbol, side, transactTime, ordType );
  }

  return GetTickCount() - start;
}